

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MaterialSystem.cpp
# Opt level: O1

aiReturn __thiscall
aiMaterial::AddBinaryProperty
          (aiMaterial *this,void *pInput,uint pSizeInBytes,char *pKey,uint type,uint index,
          aiPropertyTypeInfo pType)

{
  uint uVar1;
  int iVar2;
  aiMaterialProperty *paVar3;
  char *__dest;
  size_t sVar4;
  aiMaterialProperty **__dest_00;
  aiMaterialProperty **ppaVar5;
  ulong uVar6;
  uint uVar7;
  uint local_44;
  
  if (pInput == (void *)0x0) {
    __assert_fail("pInput != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Material/MaterialSystem.cpp"
                  ,0x1db,
                  "aiReturn aiMaterial::AddBinaryProperty(const void *, unsigned int, const char *, unsigned int, unsigned int, aiPropertyTypeInfo)"
                 );
  }
  if (pKey == (char *)0x0) {
    __assert_fail("pKey != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Material/MaterialSystem.cpp"
                  ,0x1dc,
                  "aiReturn aiMaterial::AddBinaryProperty(const void *, unsigned int, const char *, unsigned int, unsigned int, aiPropertyTypeInfo)"
                 );
  }
  if (pSizeInBytes == 0) {
    __assert_fail("0 != pSizeInBytes",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Material/MaterialSystem.cpp"
                  ,0x1dd,
                  "aiReturn aiMaterial::AddBinaryProperty(const void *, unsigned int, const char *, unsigned int, unsigned int, aiPropertyTypeInfo)"
                 );
  }
  if (this->mNumProperties == 0) {
    local_44 = 0xffffffff;
    uVar7 = 0;
  }
  else {
    local_44 = 0xffffffff;
    uVar6 = 0;
    do {
      paVar3 = this->mProperties[uVar6];
      if ((((paVar3 != (aiMaterialProperty *)0x0) &&
           (iVar2 = strcmp((paVar3->mKey).data,pKey), iVar2 == 0)) && (paVar3->mSemantic == type))
         && (paVar3->mIndex == index)) {
        if (paVar3->mData != (char *)0x0) {
          operator_delete__(paVar3->mData);
        }
        paVar3->mData = (char *)0x0;
        operator_delete(paVar3);
        local_44 = (uint)uVar6;
      }
      uVar6 = uVar6 + 1;
      uVar7 = this->mNumProperties;
    } while (uVar6 < uVar7);
  }
  paVar3 = (aiMaterialProperty *)operator_new(0x420);
  (paVar3->mKey).length = 0;
  (paVar3->mKey).data[0] = '\0';
  memset((paVar3->mKey).data + 1,0x1b,0x3ff);
  paVar3->mData = (char *)0x0;
  paVar3->mType = pType;
  paVar3->mSemantic = type;
  paVar3->mIndex = index;
  paVar3->mDataLength = pSizeInBytes;
  __dest = (char *)operator_new__((ulong)pSizeInBytes);
  paVar3->mData = __dest;
  memcpy(__dest,pInput,(ulong)pSizeInBytes);
  sVar4 = strlen(pKey);
  (paVar3->mKey).length = (ai_uint32)sVar4;
  if ((sVar4 & 0xfffffc00) != 0) {
    __assert_fail("MAXLEN > pcNew->mKey.length",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Material/MaterialSystem.cpp"
                  ,0x1fd,
                  "aiReturn aiMaterial::AddBinaryProperty(const void *, unsigned int, const char *, unsigned int, unsigned int, aiPropertyTypeInfo)"
                 );
  }
  strcpy((paVar3->mKey).data,pKey);
  if (local_44 == 0xffffffff) {
    uVar1 = this->mNumAllocated;
    if (uVar7 == uVar1) {
      this->mNumAllocated = uVar1 * 2;
      __dest_00 = (aiMaterialProperty **)operator_new__((ulong)(uVar1 * 2) << 3);
      ppaVar5 = this->mProperties;
      memcpy(__dest_00,ppaVar5,(ulong)uVar1 << 3);
      if (ppaVar5 != (aiMaterialProperty **)0x0) {
        operator_delete__(ppaVar5);
      }
      this->mProperties = __dest_00;
    }
    ppaVar5 = this->mProperties;
    local_44 = this->mNumProperties;
    this->mNumProperties = local_44 + 1;
  }
  else {
    ppaVar5 = this->mProperties;
  }
  ppaVar5[local_44] = paVar3;
  return aiReturn_SUCCESS;
}

Assistant:

aiReturn aiMaterial::AddBinaryProperty (const void* pInput,
    unsigned int pSizeInBytes,
    const char* pKey,
    unsigned int type,
    unsigned int index,
    aiPropertyTypeInfo pType
    )
{
    ai_assert( pInput != NULL );
    ai_assert( pKey != NULL );
    ai_assert( 0 != pSizeInBytes );

    if ( 0 == pSizeInBytes ) {

    }

    // first search the list whether there is already an entry with this key
    unsigned int iOutIndex( UINT_MAX );
    for ( unsigned int i = 0; i < mNumProperties; ++i ) {
        aiMaterialProperty *prop( mProperties[ i ] );

        if (prop /* just for safety */ && !strcmp( prop->mKey.data, pKey ) &&
            prop->mSemantic == type && prop->mIndex == index){

            delete mProperties[i];
            iOutIndex = i;
        }
    }

    // Allocate a new material property
    aiMaterialProperty* pcNew = new aiMaterialProperty();

    // .. and fill it
    pcNew->mType = pType;
    pcNew->mSemantic = type;
    pcNew->mIndex = index;

    pcNew->mDataLength = pSizeInBytes;
    pcNew->mData = new char[pSizeInBytes];
    memcpy (pcNew->mData,pInput,pSizeInBytes);

    pcNew->mKey.length = ::strlen(pKey);
    ai_assert ( MAXLEN > pcNew->mKey.length);
    strcpy( pcNew->mKey.data, pKey );

    if (UINT_MAX != iOutIndex)  {
        mProperties[iOutIndex] = pcNew;
        return AI_SUCCESS;
    }

    // resize the array ... double the storage allocated
    if (mNumProperties == mNumAllocated)    {
        const unsigned int iOld = mNumAllocated;
        mNumAllocated *= 2;

        aiMaterialProperty** ppTemp;
        try {
            ppTemp = new aiMaterialProperty*[mNumAllocated];
        } catch (std::bad_alloc&) {
            delete pcNew;
            return AI_OUTOFMEMORY;
        }

        // just copy all items over; then replace the old array
        memcpy (ppTemp,mProperties,iOld * sizeof(void*));

        delete[] mProperties;
        mProperties = ppTemp;
    }
    // push back ...
    mProperties[mNumProperties++] = pcNew;

    return AI_SUCCESS;
}